

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_parse_positive_int<long>(string *text,long *value_p)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  char *pcVar4;
  int digit;
  uchar c;
  char *end;
  char *start;
  long vmax_over_base;
  long vmax;
  long value;
  int base;
  long *value_p_local;
  string *text_local;
  
  vmax = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  end = (char *)std::__cxx11::string::data();
  lVar3 = std::__cxx11::string::size();
  pcVar4 = end + lVar3;
  while( true ) {
    if (pcVar4 <= end) {
      *value_p = vmax;
      return true;
    }
    iVar2 = (byte)*end - 0x30;
    if ((9 < iVar2) || (iVar2 < 0)) {
      *value_p = vmax;
      return false;
    }
    if (SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(10),0) < vmax) {
      *value_p = 0x7fffffffffffffff;
      return false;
    }
    if (0x7fffffffffffffff - (long)iVar2 < vmax * 10) break;
    vmax = (long)iVar2 + vmax * 10;
    end = end + 1;
  }
  *value_p = 0x7fffffffffffffff;
  return false;
}

Assistant:

bool safe_parse_positive_int(std::string text, IntType *value_p) {
  int base = 10;
  IntType value = 0;
  const IntType vmax = std::numeric_limits<IntType>::max();
  assert(vmax > 0);
  assert(vmax >= base);
  const IntType vmax_over_base = vmax / base;
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    int digit = c - '0';
    if (digit >= base || digit < 0) {
      *value_p = value;
      return false;
    }
    if (value > vmax_over_base) {
      *value_p = vmax;
      return false;
    }
    value *= base;
    if (value > vmax - digit) {
      *value_p = vmax;
      return false;
    }
    value += digit;
  }
  *value_p = value;
  return true;
}